

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O2

void * __kmp_task_reduction_init<kmp_task_red_input>(int gtid,int num,kmp_task_red_input *data)

{
  undefined8 *puVar1;
  uint uVar2;
  kmp_taskred_flags_t kVar3;
  kmp_info_t *th;
  kmp_taskgroup_t *pkVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  kmp_task_red_input *pkVar11;
  size_t size;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  
  th = __kmp_threads[gtid];
  pkVar4 = ((th->th).th_current_task)->td_taskgroup;
  uVar2 = (th->th).th_team_nproc;
  if (pkVar4 == (kmp_taskgroup_t *)0x0) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/flang-compiler[P]openmp/runtime/src/kmp_tasking.cpp"
                       ,0x84f);
  }
  if (data != (kmp_task_red_input *)0x0) {
    if (num < 1) {
      __kmp_debug_assert("assertion failure",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/flang-compiler[P]openmp/runtime/src/kmp_tasking.cpp"
                         ,0x851);
    }
    if (uVar2 != 1) {
      pvVar5 = ___kmp_thread_malloc(th,(long)num * 0x48);
      uVar10 = 0;
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      uVar7 = 0;
      if (0 < num) {
        uVar7 = (ulong)(uint)num;
      }
      for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
        if (data[uVar10].reduce_comb == (void *)0x0) {
          __kmp_debug_assert("assertion failure",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/flang-compiler[P]openmp/runtime/src/kmp_tasking.cpp"
                             ,0x85f);
        }
        pkVar11 = data + uVar10;
        lVar14 = (data[uVar10].reduce_size - (ulong)((int)data[uVar10].reduce_size - 1U & 0x3f)) +
                 0x3f;
        lVar9 = uVar10 * 0x48;
        *(void **)((long)pvVar5 + lVar9) = pkVar11->reduce_shar;
        *(long *)((long)pvVar5 + lVar9 + 8) = lVar14;
        kVar3 = pkVar11->flags;
        *(kmp_taskred_flags_t *)((long)pvVar5 + lVar9 + 0x10) = kVar3;
        *(void **)((long)pvVar5 + lVar9 + 0x28) = pkVar11->reduce_comb;
        pvVar8 = pkVar11->reduce_fini;
        puVar1 = (undefined8 *)((long)pvVar5 + lVar9 + 0x30);
        *puVar1 = pkVar11->reduce_init;
        puVar1[1] = pvVar8;
        *(undefined8 *)((long)pvVar5 + lVar9 + 0x40) = 0;
        if (((uint)kVar3 & 1) == 0) {
          size = lVar14 * (int)uVar2;
          pvVar8 = ___kmp_allocate(size);
          *(void **)((long)pvVar5 + lVar9 + 0x18) = pvVar8;
          *(void **)((long)pvVar5 + lVar9 + 0x20) = (void *)(size + (long)pvVar8);
          if (*(long *)((long)pvVar5 + lVar9 + 0x30) != 0) {
            lVar13 = 0;
            uVar12 = uVar6;
            while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
              (**(code **)((long)pvVar5 + lVar9 + 0x30))
                        ((lVar13 >> 0x20) + *(long *)((long)pvVar5 + lVar9 + 0x18));
              lVar13 = lVar13 + (lVar14 << 0x20);
            }
          }
        }
        else {
          pvVar8 = ___kmp_allocate((long)(int)uVar2 * 8);
          *(void **)((long)pvVar5 + lVar9 + 0x18) = pvVar8;
        }
      }
      pkVar4->reduce_data = pvVar5;
      pkVar4->reduce_num_data = num;
    }
    return pkVar4;
  }
  __kmp_debug_assert("assertion failure",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/flang-compiler[P]openmp/runtime/src/kmp_tasking.cpp"
                     ,0x850);
}

Assistant:

void *__kmp_task_reduction_init(int gtid, int num, T *data) {
  kmp_info_t *thread = __kmp_threads[gtid];
  kmp_taskgroup_t *tg = thread->th.th_current_task->td_taskgroup;
  kmp_int32 nth = thread->th.th_team_nproc;
  kmp_taskred_data_t *arr;

  // check input data just in case
  KMP_ASSERT(tg != NULL);
  KMP_ASSERT(data != NULL);
  KMP_ASSERT(num > 0);
  if (nth == 1) {
    KA_TRACE(10, ("__kmpc_task_reduction_init: T#%d, tg %p, exiting nth=1\n",
                  gtid, tg));
    return (void *)tg;
  }
  KA_TRACE(10, ("__kmpc_task_reduction_init: T#%d, taskgroup %p, #items %d\n",
                gtid, tg, num));
  arr = (kmp_taskred_data_t *)__kmp_thread_malloc(
      thread, num * sizeof(kmp_taskred_data_t));
  for (int i = 0; i < num; ++i) {
    size_t size = data[i].reduce_size - 1;
    // round the size up to cache line per thread-specific item
    size += CACHE_LINE - size % CACHE_LINE;
    KMP_ASSERT(data[i].reduce_comb != NULL); // combiner is mandatory
    arr[i].reduce_shar = data[i].reduce_shar;
    arr[i].reduce_size = size;
    arr[i].flags = data[i].flags;
    arr[i].reduce_comb = data[i].reduce_comb;
    arr[i].reduce_init = data[i].reduce_init;
    arr[i].reduce_fini = data[i].reduce_fini;
    __kmp_assign_orig<T>(arr[i], data[i]);
    if (!arr[i].flags.lazy_priv) {
      // allocate cache-line aligned block and fill it with zeros
      arr[i].reduce_priv = __kmp_allocate(nth * size);
      arr[i].reduce_pend = (char *)(arr[i].reduce_priv) + nth * size;
      if (arr[i].reduce_init != NULL) {
        // initialize all thread-specific items
        for (int j = 0; j < nth; ++j) {
          __kmp_call_init<T>(arr[i], j * size);
        }
      }
    } else {
      // only allocate space for pointers now,
      // objects will be lazily allocated/initialized if/when requested
      // note that __kmp_allocate zeroes the allocated memory
      arr[i].reduce_priv = __kmp_allocate(nth * sizeof(void *));
    }
  }
  tg->reduce_data = (void *)arr;
  tg->reduce_num_data = num;
  return (void *)tg;
}